

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void luaF_close(lua_State *L,StkId level)

{
  undefined4 uVar1;
  global_State *pgVar2;
  bool bVar3;
  TValue *o1;
  TValue *o2;
  GCObject *o;
  global_State *g;
  UpVal *uv;
  StkId level_local;
  lua_State *L_local;
  
  pgVar2 = L->l_G;
  while( true ) {
    bVar3 = false;
    if (L->openupval != (GCObject *)0x0) {
      g = (global_State *)L->openupval;
      bVar3 = level <= ((Table *)g)->metatable;
    }
    if (!bVar3) break;
    L->openupval = (GCObject *)(g->strt).hash;
    if ((*(byte *)((long)&(g->strt).nuse + 1) & (pgVar2->currentwhite ^ 3) & 3) == 0) {
      unlinkupval((UpVal *)g);
      g->ud = *(void **)g->frealloc;
      uVar1 = *(undefined4 *)(g->frealloc + 8);
      g->currentwhite = (char)uVar1;
      g->gcstate = (char)((uint)uVar1 >> 8);
      *(short *)&g->field_0x22 = (short)((uint)uVar1 >> 0x10);
      g->frealloc = (lua_Alloc)&g->ud;
      luaC_linkupval(L,(UpVal *)g);
    }
    else {
      luaF_freeupval(L,(UpVal *)g);
    }
  }
  return;
}

Assistant:

static void luaF_close(lua_State*L,StkId level){
UpVal*uv;
global_State*g=G(L);
while(L->openupval!=NULL&&(uv=ngcotouv(L->openupval))->v>=level){
GCObject*o=obj2gco(uv);
L->openupval=uv->next;
if(isdead(g,o))
luaF_freeupval(L,uv);
else{
unlinkupval(uv);
setobj(L,&uv->u.value,uv->v);
uv->v=&uv->u.value;
luaC_linkupval(L,uv);
}
}
}